

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O2

bool __thiscall
duckdb::StringStatisticsState::TryTruncateMax
          (StringStatisticsState *this,string_t str,idx_t max_size,string *result,data_t max_byte)

{
  char *pcVar1;
  long lVar2;
  idx_t iVar3;
  long lVar4;
  bool bVar5;
  undefined8 local_48;
  long local_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_40 = str.value._8_8_;
  local_48 = str.value._0_8_;
  bVar5 = str.value._0_4_ < 0xd;
  lVar4 = local_40;
  if (bVar5) {
    lVar4 = (long)&local_48 + 4;
  }
  lVar2 = (long)&local_48 + 3;
  if (!bVar5) {
    lVar2 = local_40 + -1;
  }
  do {
    iVar3 = max_size;
    if (iVar3 == 0) goto LAB_01f0508b;
    max_size = iVar3 - 1;
  } while (max_byte <= *(byte *)(lVar2 + iVar3));
  local_38[0] = local_28;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_38,lVar4,lVar4 + iVar3);
  ::std::__cxx11::string::operator=((string *)result,(string *)local_38);
  ::std::__cxx11::string::~string((string *)local_38);
  pcVar1 = (result->_M_dataplus)._M_p + (iVar3 - 1);
  *pcVar1 = *pcVar1 + '\x01';
LAB_01f0508b:
  return iVar3 != 0;
}

Assistant:

bool TryTruncateMax(string_t str, idx_t max_size, string &result, data_t max_byte) {
		auto data = const_data_ptr_cast(str.GetData());

		// find the last position in the string which we can increment for the truncation
		// if ALL characters are above the max byte we cannot truncate
		idx_t increment_pos;
		for (increment_pos = max_size; increment_pos > 0; increment_pos--) {
			idx_t str_idx = increment_pos - 1;
			if (data[str_idx] < max_byte) {
				// found the increment position
				break;
			}
		}
		if (increment_pos == 0) {
			// all characters are above the max byte - we cannot truncate - return false
			return false;
		}
		// set up the result string - we don't care about anything after the increment pos
		result = string(str.GetData(), increment_pos);
		// actually increment
		result[increment_pos - 1]++;
		return true;
	}